

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

void __thiscall cmQtAutoMocUic::MocSettingsT::MocSettingsT(MocSettingsT *this)

{
  this->Enabled = false;
  this->SettingsChanged = false;
  this->RelaxedMode = false;
  (this->ExecutableTime).NS = 0;
  (this->Executable)._M_dataplus._M_p = (pointer)&(this->Executable).field_2;
  (this->Executable)._M_string_length = 0;
  (this->Executable).field_2._M_local_buf[0] = '\0';
  (this->CompFileAbs)._M_dataplus._M_p = (pointer)&(this->CompFileAbs).field_2;
  (this->CompFileAbs)._M_string_length = 0;
  (this->CompFileAbs).field_2._M_local_buf[0] = '\0';
  (this->PredefsFileRel)._M_dataplus._M_p = (pointer)&(this->PredefsFileRel).field_2;
  (this->PredefsFileRel)._M_string_length = 0;
  (this->PredefsFileRel).field_2._M_local_buf[0] = '\0';
  (this->PredefsFileAbs)._M_dataplus._M_p = (pointer)&(this->PredefsFileAbs).field_2;
  (this->PredefsFileAbs)._M_string_length = 0;
  (this->PredefsFileAbs).field_2._M_local_buf[0] = '\0';
  (this->SkipList)._M_h._M_buckets = &(this->SkipList)._M_h._M_single_bucket;
  (this->SkipList)._M_h._M_bucket_count = 1;
  (this->SkipList)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SkipList)._M_h._M_element_count = 0;
  (this->SkipList)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->RegExpInclude).regmatch.endp[0] = (char *)0x0;
  (this->RegExpInclude).regmatch.searchstring = (char *)0x0;
  (this->RegExpInclude).program = (char *)0x0;
  memset(&(this->SkipList)._M_h._M_rehash_policy._M_next_resize,0,0xd8);
  cmsys::RegularExpression::compile
            (&this->RegExpInclude,
             "(^|\n)[ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  return;
}

Assistant:

cmQtAutoMocUic::MocSettingsT::MocSettingsT()
{
  RegExpInclude.compile(
    "(^|\n)[ \t]*#[ \t]*include[ \t]+"
    "[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]");
}